

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart_ping_pong.c
# Opt level: O0

cio_error setup_client(client *client,cio_io_stream *stream)

{
  cio_error cVar1;
  cio_error err;
  cio_io_stream *stream_local;
  client *client_local;
  
  cVar1 = cio_buffered_stream_init(&client->bs,stream);
  if (cVar1 == CIO_SUCCESS) {
    cVar1 = cio_read_buffer_init(&client->rb,client->buffer,0x80);
    if (cVar1 == CIO_SUCCESS) {
      client_local._4_4_ = CIO_SUCCESS;
    }
    else {
      fprintf(_stderr,"failed to init read buffer!\n");
      client_local._4_4_ = CIO_EOF;
    }
  }
  else {
    fprintf(_stderr,"failed to init buffered stream!\n");
    client_local._4_4_ = CIO_EOF;
  }
  return client_local._4_4_;
}

Assistant:

static enum cio_error setup_client(struct client *client, struct cio_io_stream *stream)
{
	enum cio_error err = cio_buffered_stream_init(&client->bs, stream);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init buffered stream!\n");
		return EXIT_FAILURE;
	}
	err = cio_read_buffer_init(&client->rb, client->buffer, sizeof(client->buffer));
	if (cio_unlikely(err != CIO_SUCCESS)) {
		(void)fprintf(stderr, "failed to init read buffer!\n");
		return EXIT_FAILURE;
	}

	return CIO_SUCCESS;
}